

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_assign_statement_t *stmt)

{
  typed_lvalue_expression_t *lvalue;
  typed_expression_t *rvalue;
  invalid_argument *this_00;
  
  if ((stmt->super_typed_statement_t)._type == STMT_TYPE_INTASSIGN) {
    lvalue = typed_assign_statement_t::lvalue(stmt);
    rvalue = typed_assign_statement_t::rvalue(stmt);
    compile_int_assign(this,lvalue,rvalue);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid statement");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual void visit(tchecker::typed_assign_statement_t const & stmt)
  {
    if (stmt.type() != tchecker::STMT_TYPE_INTASSIGN)
      throw std::invalid_argument("invalid statement");

    compile_int_assign(stmt.lvalue(), stmt.rvalue());
  }